

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O1

matrix sptk::swipe::zerom(int xSz,int ySz)

{
  double **ppdVar1;
  double *pdVar2;
  ulong uVar3;
  matrix mVar4;
  
  ppdVar1 = (double **)malloc((long)xSz * 8);
  if (0 < xSz) {
    uVar3 = 0;
    do {
      pdVar2 = (double *)calloc(8,(long)ySz);
      ppdVar1[uVar3] = pdVar2;
      uVar3 = uVar3 + 1;
    } while ((uint)xSz != uVar3);
  }
  mVar4.y = ySz;
  mVar4.x = xSz;
  mVar4.m = ppdVar1;
  return mVar4;
}

Assistant:

matrix zerom(int xSz, int ySz) {
    matrix nw_matrix;
    nw_matrix.x = xSz;
    nw_matrix.y = ySz;
#if 0
    nw_matrix.m = malloc(sizeof(double*) * xSz);
#else
    nw_matrix.m = (double**) malloc(sizeof(double*) * xSz);
#endif
    int i;
    for (i = 0; i < nw_matrix.x; i++)
#if 0
        nw_matrix.m[i] = calloc(sizeof(double), ySz);
#else
        nw_matrix.m[i] = (double*) calloc(sizeof(double), ySz);
#endif
    return(nw_matrix);
}